

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-trust-schema-pattern.c
# Opt level: O2

int ndn_trust_schema_pattern_from_string
              (ndn_trust_schema_pattern_t *pattern,char *string,uint32_t size)

{
  char cVar1;
  bool bVar2;
  uint8_t uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  byte bVar7;
  uint32_t i;
  ulong uVar8;
  int __length;
  ulong uVar9;
  re_registers *__regs;
  re_registers *__regs_00;
  uint uVar10;
  char *pcVar11;
  undefined1 local_94 [8];
  ndn_trust_schema_pattern_component_t component;
  byte local_3c;
  uint local_34;
  
  if (size == 0) {
    iVar4 = -0x9c;
  }
  else {
    component._52_8_ = ZEXT48(size);
    if (string[size - 1] == '\0') {
      component._52_8_ = ZEXT48(size - 1);
    }
    uVar8 = 0;
    do {
      if ((uint32_t)component._52_8_ - 1 == uVar8) {
        pattern->components_size = 0;
        if ((0x34 < (byte)*string - 0x28) ||
           (uVar8 = 0x18000000100001,
           (0x18000000100001U >> ((ulong)((byte)*string - 0x28) & 0x3f) & 1) == 0)) {
          iVar4 = ndn_trust_schema_pattern_component_from_string
                            ((ndn_trust_schema_pattern_component_t *)local_94,string,
                             (uint32_t)component._52_8_);
          if (iVar4 != 0) {
            return iVar4;
          }
          iVar4 = ndn_trust_schema_pattern_append_component
                            (pattern,(ndn_trust_schema_pattern_component_t *)local_94);
          return iVar4;
        }
        __regs_00 = (re_registers *)0x0;
        local_34 = 0;
        local_3c = 0;
        uVar10 = 0;
        uVar3 = '\0';
        uVar9 = component._52_8_;
        pcVar11 = string;
        goto LAB_0010f4dc;
      }
      pcVar11 = string + uVar8;
      uVar8 = uVar8 + 1;
    } while (*pcVar11 != '\0');
    iVar4 = -0x9d;
  }
  return iVar4;
LAB_0010f4dc:
  uVar5 = (uint)uVar9;
  if (uVar5 <= (uint)((int)pcVar11 - (int)string)) {
    if ((byte)local_34 != local_3c) {
      return -0x9e;
    }
    pattern->num_subpattern_captures = (byte)local_34;
    pattern->num_subpattern_indexes = uVar3;
    return 0;
  }
  cVar1 = *pcVar11;
  if (cVar1 == '\0') {
    iVar4 = -1;
    uVar5 = uVar10;
LAB_0010f5a3:
    uVar8 = (ulong)(uVar5 ^ 1);
    bVar2 = uVar10 == 1;
    uVar10 = uVar5;
    if (bVar2 && (uVar5 ^ 1) == 0) {
      return -0x9f;
    }
LAB_0010f630:
    component.value[0x2a] = '\0';
    iVar6 = ndn_trust_schema_pattern_component_from_string
                      ((ndn_trust_schema_pattern_component_t *)local_94,pcVar11,iVar4 + 1U);
    if (iVar6 != 0) {
      return iVar6;
    }
    if (((ulong)__regs_00 & 1) != 0) {
      component.value[0x2a] = component.value[0x2a] | (byte)local_34 | 0x80;
      bVar7 = (byte)local_34 + 1;
      local_34 = (uint)bVar7;
      uVar8 = (ulong)local_34;
      if (4 < bVar7) {
        return -0xa0;
      }
    }
    iVar6 = ndn_trust_schema_pattern_append_component
                      (pattern,(ndn_trust_schema_pattern_component_t *)local_94);
    if (iVar6 != 0) {
      return iVar6;
    }
    pcVar11 = pcVar11 + (int)(iVar4 + 1U);
    __regs_00 = (re_registers *)0x0;
    uVar9 = component._52_8_;
    goto LAB_0010f4dc;
  }
  iVar4 = (int)uVar8;
  if (cVar1 == '(') {
    iVar4 = re_match((re_pattern_buffer *)")",pcVar11,uVar5,iVar4,__regs_00);
    if (iVar4 == -1) {
      return -0x9e;
    }
    pcVar11 = pcVar11 + 1;
    __regs_00 = (re_registers *)CONCAT71((int7)((ulong)__regs_00 >> 8),1);
    uVar9 = component._52_8_;
  }
  else {
    if (cVar1 != ')') {
      if (cVar1 == '\\') {
        iVar4 = re_match((re_pattern_buffer *)"[0-9]",pcVar11,uVar5,iVar4,__regs_00);
        if (iVar4 == -1) {
          return -0x9e;
        }
        uVar3 = uVar3 + '\x01';
        uVar10 = 4;
      }
      else if (cVar1 == '[') {
        iVar4 = re_match((re_pattern_buffer *)0x11b2c2,pcVar11,uVar5,iVar4,__regs_00);
        uVar10 = 5;
        if (iVar4 == -1) {
          return -0x9e;
        }
      }
      else {
        if (cVar1 != '<') {
          return -0x9e;
        }
        __regs = __regs_00;
        iVar4 = re_match((re_pattern_buffer *)"^<>\\*",pcVar11,uVar5,iVar4,__regs_00);
        if (iVar4 != -1) {
          iVar4 = iVar4 + 2;
          uVar5 = 1;
          goto LAB_0010f5a3;
        }
        iVar4 = re_match((re_pattern_buffer *)0x11aed0,pcVar11,__length,(int)uVar8,__regs);
        if (iVar4 == -1) {
          return -0x9e;
        }
        uVar10 = iVar4 == 2 ^ 3;
      }
      goto LAB_0010f630;
    }
    uVar5 = pattern->components_size - 1;
    uVar8 = CONCAT71((int7)(uVar8 >> 8),pattern->components[uVar5].subpattern_info | local_3c) |
            0x40;
    pattern->components[uVar5].subpattern_info = (uint8_t)uVar8;
    local_3c = local_3c + 1;
    pcVar11 = pcVar11 + 1;
  }
  goto LAB_0010f4dc;
}

Assistant:

int
ndn_trust_schema_pattern_from_string(ndn_trust_schema_pattern_t* pattern,
                                     const char* string, uint32_t size)
{
  if (size == 0) return NDN_TRUST_SCHEMA_PATTERN_STRING_ZERO_LENGTH;

  if (string[size - 1] == '\0') size--;

  for (uint32_t i = 0; i < size - 1; i++) {
    if (string[i] == '\0')
      return NDN_TRUST_SCHEMA_PATTERN_STRING_PREMATURE_TERMINATION;
  }

  int ret_val = -1;

  pattern->components_size = 0;

  // first check if it's a rule reference
  if (string[0] != '<' && string[0] != '(' && string[0] != '['
      && string[0] != '\\') {
    ndn_trust_schema_pattern_component_t component;
    ret_val = ndn_trust_schema_pattern_component_from_string(&component, string, size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = ndn_trust_schema_pattern_append_component(pattern, &component);
    if (ret_val != NDN_SUCCESS) return ret_val;
    return 0;
  }

  // flag to remember whether the pattern component being appended should be
  // marked as the beginning of a subpattern (SPB = Sub Pattern Beginning)
  bool should_add_SPB = false;
  // current subpattern index; will return error if more than
  // NDN_TRUST_SCHEMA_MAX_SUBPATTERN_MATCHES subpatterns are found
  uint8_t current_subpattern_capture_begin_index = 0;
  uint8_t current_subpattern_capture_end_index = 0;
  const char* current_string = string;
  uint32_t last_type = NDN_TRUST_SCHEMA_NO_TYPE;
  uint32_t current_type = NDN_TRUST_SCHEMA_NO_TYPE;
  uint8_t num_subpattern_indexes = 0;
  // iterate through the schema pattern
  while ((uint32_t)(current_string - string) < size) {
    int pattern_comp_end_index = -1;
    switch (current_string[0]) {
      case '<':
        pattern_comp_end_index = re_match("^<>\\*", current_string);
        if (pattern_comp_end_index == TINY_REGEX_C_FAIL) {
          pattern_comp_end_index = re_match(">", current_string);
          if (pattern_comp_end_index == TINY_REGEX_C_FAIL)
            return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
          else
            current_type = (pattern_comp_end_index == 2)
                               ? NDN_TRUST_SCHEMA_WILDCARD_NAME_COMPONENT
                               : NDN_TRUST_SCHEMA_SINGLE_NAME_COMPONENT;
        } else {
          current_type = NDN_TRUST_SCHEMA_WILDCARD_NAME_COMPONENT_SEQUENCE;
          pattern_comp_end_index += 2;
        }
        break;
      case '[':
        pattern_comp_end_index = re_match("]", current_string);
        if (pattern_comp_end_index == TINY_REGEX_C_FAIL)
          return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
        else
          current_type = NDN_TRUST_SCHEMA_WILDCARD_SPECIALIZER;
        break;
      case '\\':
        pattern_comp_end_index = re_match("[0-9]", current_string);
        if (pattern_comp_end_index == TINY_REGEX_C_FAIL)
          return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
        else
          current_type = NDN_TRUST_SCHEMA_SUBPATTERN_INDEX;
        num_subpattern_indexes++;
        break;
      case '(':
        // make sure that there is a corresponding end parentheses for this
        // subpattern
        pattern_comp_end_index = re_match(")", current_string);
        if (pattern_comp_end_index == TINY_REGEX_C_FAIL)
          return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
        should_add_SPB = true;
        current_string += 1;
        continue;
      case ')':
        // set the last pattern component's subpattern info to indicate that it
        // was the ending of a subpattern
        pattern->components[pattern->components_size - 1].subpattern_info |=
            (NDN_TRUST_SCHEMA_SUBPATTERN_END_ONLY << 6) |
            (current_subpattern_capture_end_index);
        current_subpattern_capture_end_index++;
        current_string += 1;
        continue;
      default:
        if (current_string[0] == '\0')
          break;
        else
          return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
    }

    // do not allow more than one consecutive wildcard name component sequences
    if (current_type == NDN_TRUST_SCHEMA_WILDCARD_NAME_COMPONENT_SEQUENCE
        && last_type == NDN_TRUST_SCHEMA_WILDCARD_NAME_COMPONENT_SEQUENCE)
      return NDN_TRUST_SCHEMA_PATTERN_INVALID_FORMAT;
    last_type = current_type;

    int pattern_comp_string_len = pattern_comp_end_index + 1;

    ndn_trust_schema_pattern_component_t component;
    component.subpattern_info = 0;
    ret_val = ndn_trust_schema_pattern_component_from_string(
        &component, current_string, pattern_comp_string_len);
    if (ret_val != NDN_SUCCESS) return ret_val;

    if (should_add_SPB) {
      // set the current pattern component's subpattern info to indicate that it
      // was the beginning of a subpattern
      component.subpattern_info |=
          (NDN_TRUST_SCHEMA_SUBPATTERN_BEGIN_ONLY << 6) |
          (current_subpattern_capture_begin_index);
      current_subpattern_capture_begin_index++;
      if (current_subpattern_capture_begin_index + 1 >
          NDN_TRUST_SCHEMA_MAX_SUBPATTERN_MATCHES) {
        return NDN_TRUST_SCHEMA_NUMBER_OF_SUBPATTERNS_EXCEEDS_LIMIT;
      }
      should_add_SPB = false;
    }

    ret_val = ndn_trust_schema_pattern_append_component(pattern, &component);
    if (ret_val != NDN_SUCCESS) return ret_val;

    current_string += pattern_comp_end_index + 1;
  }

  if (current_subpattern_capture_begin_index !=
      current_subpattern_capture_end_index) {
    return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_PARSING_ERROR;
  }

  pattern->num_subpattern_captures = current_subpattern_capture_begin_index;
  pattern->num_subpattern_indexes = num_subpattern_indexes;

  return 0;
}